

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# groups.hpp
# Opt level: O0

void __thiscall Args::AllOfGroup::checkCorrectnessAfterParsing(AllOfGroup *this)

{
  bool bVar1;
  const_iterator cVar2;
  const_iterator cVar3;
  GroupIface *this_00;
  GroupIface *in_RDI;
  bool all;
  bool defined;
  vector<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>
  *in_stack_ffffffffffffff08;
  allocator *__rhs;
  undefined7 in_stack_ffffffffffffff20;
  undefined1 uVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff48;
  allocator local_a1;
  string local_a0 [104];
  unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_> *local_38;
  unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_> *local_30;
  undefined1 local_22;
  GroupIface *in_stack_ffffffffffffffe0;
  
  GroupIface::checkCorrectnessAfterParsing(in_stack_ffffffffffffffe0);
  GroupIface::children(in_RDI);
  cVar2 = std::
          vector<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>
          ::cbegin(in_stack_ffffffffffffff08);
  GroupIface::children(in_RDI);
  cVar3 = std::
          vector<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>
          ::cend(in_stack_ffffffffffffff08);
  bVar1 = std::
          any_of<__gnu_cxx::__normal_iterator<std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>const*,std::vector<std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>,std::allocator<std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>>>>,Args::AllOfGroup::checkCorrectnessAfterParsing()const::_lambda(auto:1_const&)_1_>
                    (cVar2._M_current,cVar3._M_current);
  GroupIface::children(in_RDI);
  local_30 = (unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_> *)
             std::
             vector<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>
             ::cbegin(in_stack_ffffffffffffff08);
  GroupIface::children(in_RDI);
  local_38 = (unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_> *)
             std::
             vector<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>
             ::cend(in_stack_ffffffffffffff08);
  local_22 = std::
             all_of<__gnu_cxx::__normal_iterator<std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>const*,std::vector<std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>,std::allocator<std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>>>>,Args::AllOfGroup::checkCorrectnessAfterParsing()const::_lambda(auto:1_const&)_2_>
                       (local_30,local_38);
  if ((bVar1) && (!(bool)local_22)) {
    uVar4 = 1;
    this_00 = (GroupIface *)__cxa_allocate_exception(0x30);
    __rhs = &local_a1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_a0,"All arguments in AllOf group \"",__rhs);
    GroupIface::name_abi_cxx11_(this_00);
    std::operator+(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI,
                   (char *)__rhs);
    BaseException::BaseException
              ((BaseException *)CONCAT17(uVar4,in_stack_ffffffffffffff20),(String *)in_RDI);
    __cxa_throw(this_00,&BaseException::typeinfo,BaseException::~BaseException);
  }
  return;
}

Assistant:

void checkCorrectnessAfterParsing() const override
	{
		GroupIface::checkCorrectnessAfterParsing();

		const bool defined = std::any_of( children().cbegin(), children().cend(),
			[] ( const auto & arg ) { return arg->isDefined(); } );

		const bool all = std::all_of( children().cbegin(), children().cend(),
			[] ( const auto & arg ) { return arg->isDefined(); } );

		if( defined && !all )
			throw BaseException( String( SL( "All arguments in "
				"AllOf group \"" ) ) + name() + SL( "\" should be defined." ) );
	}